

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetShaderCodeBufferDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,ShaderCodeBufferDesc *Desc,
          size_t GlobalIdent,size_t MemberIdent)

{
  ostream *poVar1;
  stringstream ss;
  long local_1a0 [2];
  long alStack_190 [45];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(long *)((long)alStack_190 + *(long *)(local_1a0[0] + -0x18)) = (long)(int)Desc;
  poVar1 = std::operator<<((ostream *)local_1a0,' ');
  poVar1 = std::operator<<(poVar1,"Size: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)(int)Desc;
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,"Vars: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  PrintShaderCodeVariables
            (&ss,(long)&Desc->Size + GlobalIdent,GlobalIdent,*(ShaderCodeVariableDesc **)(this + 8),
             *(Uint32 *)(this + 4));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

String GetShaderCodeBufferDescString(const ShaderCodeBufferDesc& Desc, size_t GlobalIdent, size_t MemberIdent)
{
    std::stringstream ss;
    ss << std::setw(static_cast<int>(GlobalIdent)) << ' ' << "Size: " << Desc.Size << std::endl
       << std::setw(static_cast<int>(GlobalIdent)) << ' ' << "Vars: " << Desc.NumVariables << std::endl;
    PrintShaderCodeVariables(ss, GlobalIdent + MemberIdent, MemberIdent, Desc.pVariables, Desc.NumVariables);

    return ss.str();
}